

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_expression.hpp
# Opt level: O0

BoundAggregateExpression * __thiscall
duckdb::BaseExpression::Cast<duckdb::BoundAggregateExpression>(BaseExpression *this)

{
  InternalException *this_00;
  BoundAggregateExpression *in_RDI;
  allocator local_29;
  string local_28 [40];
  
  if (in_RDI[9] != (BoundAggregateExpression)0x19) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_28,"Failed to cast expression to type - expression type mismatch",&local_29);
    duckdb::InternalException::InternalException(this_00,local_28);
    __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return in_RDI;
}

Assistant:

TARGET &Cast() {
		if (expression_class != TARGET::TYPE) {
			throw InternalException("Failed to cast expression to type - expression type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}